

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::Track::PayloadSize(Track *this)

{
  uint64 uVar1;
  uint64 uVar2;
  uint64 uVar3;
  uint64_t uVar4;
  uint8 *in_RDI;
  ContentEncoding *encoding;
  uint32_t i;
  uint64_t content_encodings_size;
  uint64_t size;
  uint64 in_stack_ffffffffffffffc8;
  uint64 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar5;
  long local_18;
  uint64_t local_10;
  
  uVar1 = EbmlElementSize((uint64)in_RDI,in_stack_ffffffffffffffc8);
  uVar2 = EbmlElementSize((uint64)in_RDI,in_stack_ffffffffffffffc8);
  uVar3 = EbmlElementSize((uint64)in_RDI,in_stack_ffffffffffffffc8);
  local_10 = uVar3 + uVar2 + uVar1;
  if (*(long *)(in_RDI + 8) != 0) {
    uVar1 = EbmlElementSize(in_stack_ffffffffffffffd8,(char *)in_RDI);
    local_10 = uVar1 + local_10;
  }
  if (*(long *)(in_RDI + 0x10) != 0) {
    uVar1 = EbmlElementSize(in_stack_ffffffffffffffd8,in_RDI,in_stack_ffffffffffffffc8);
    local_10 = uVar1 + local_10;
  }
  if (*(long *)(in_RDI + 0x18) != 0) {
    uVar1 = EbmlElementSize(in_stack_ffffffffffffffd8,(char *)in_RDI);
    local_10 = uVar1 + local_10;
  }
  if (*(long *)(in_RDI + 0x28) != 0) {
    uVar1 = EbmlElementSize(in_stack_ffffffffffffffd8,(char *)in_RDI);
    local_10 = uVar1 + local_10;
  }
  if (*(long *)(in_RDI + 0x20) != 0) {
    uVar1 = EbmlElementSize((uint64)in_RDI,in_stack_ffffffffffffffc8);
    local_10 = uVar1 + local_10;
  }
  if (*(long *)(in_RDI + 0x48) != 0) {
    uVar1 = EbmlElementSize((uint64)in_RDI,in_stack_ffffffffffffffc8);
    local_10 = uVar1 + local_10;
  }
  if (*(long *)(in_RDI + 0x50) != 0) {
    uVar1 = EbmlElementSize((uint64)in_RDI,in_stack_ffffffffffffffc8);
    local_10 = uVar1 + local_10;
  }
  if (*(long *)(in_RDI + 0x58) != 0) {
    uVar1 = EbmlElementSize((uint64)in_RDI,in_stack_ffffffffffffffc8);
    local_10 = uVar1 + local_10;
  }
  if (*(int *)(in_RDI + 0x70) != 0) {
    local_18 = 0;
    for (uVar5 = 0; uVar5 < *(uint *)(in_RDI + 0x70); uVar5 = uVar5 + 1) {
      uVar4 = ContentEncoding::Size((ContentEncoding *)CONCAT44(uVar5,in_stack_ffffffffffffffe0));
      local_18 = uVar4 + local_18;
    }
    uVar1 = EbmlMasterElementSize((uint64)in_RDI,in_stack_ffffffffffffffc8);
    local_10 = uVar1 + local_18 + local_10;
  }
  return local_10;
}

Assistant:

uint64_t Track::PayloadSize() const {
  uint64_t size =
      EbmlElementSize(libwebm::kMkvTrackNumber, static_cast<uint64>(number_));
  size += EbmlElementSize(libwebm::kMkvTrackUID, static_cast<uint64>(uid_));
  size += EbmlElementSize(libwebm::kMkvTrackType, static_cast<uint64>(type_));
  if (codec_id_)
    size += EbmlElementSize(libwebm::kMkvCodecID, codec_id_);
  if (codec_private_)
    size += EbmlElementSize(libwebm::kMkvCodecPrivate, codec_private_,
                            codec_private_length_);
  if (language_)
    size += EbmlElementSize(libwebm::kMkvLanguage, language_);
  if (name_)
    size += EbmlElementSize(libwebm::kMkvName, name_);
  if (max_block_additional_id_) {
    size += EbmlElementSize(libwebm::kMkvMaxBlockAdditionID,
                            static_cast<uint64>(max_block_additional_id_));
  }
  if (codec_delay_) {
    size += EbmlElementSize(libwebm::kMkvCodecDelay,
                            static_cast<uint64>(codec_delay_));
  }
  if (seek_pre_roll_) {
    size += EbmlElementSize(libwebm::kMkvSeekPreRoll,
                            static_cast<uint64>(seek_pre_roll_));
  }
  if (default_duration_) {
    size += EbmlElementSize(libwebm::kMkvDefaultDuration,
                            static_cast<uint64>(default_duration_));
  }

  if (content_encoding_entries_size_ > 0) {
    uint64_t content_encodings_size = 0;
    for (uint32_t i = 0; i < content_encoding_entries_size_; ++i) {
      ContentEncoding* const encoding = content_encoding_entries_[i];
      content_encodings_size += encoding->Size();
    }

    size += EbmlMasterElementSize(libwebm::kMkvContentEncodings,
                                  content_encodings_size) +
            content_encodings_size;
  }

  return size;
}